

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool,_int,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                          .super__Tuple_impl<3UL,_testing::internal::ParamIterator<bool>_>.
                          super__Head_base<3UL,_testing::internal::ParamIterator<bool>,_false>.
                          _M_head_impl.impl_ + 0x18))();
    CartesianProductGenerator<trust_token_method_st_const*,bool,int,bool>::
    IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>
              ((IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>> *)this);
    ComputeCurrentValue(this);
    return;
  }
  __assert_fail("!AtEnd()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                ,0x361,
                "virtual void testing::internal::CartesianProductGenerator<const trust_token_method_st *, bool, int, bool>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1, 2, 3>>::Advance() [T = <const trust_token_method_st *, bool, int, bool>, I = std::integer_sequence<unsigned long, 0, 1, 2, 3>]"
               );
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }